

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

S2Cap * __thiscall S2CellUnion::GetCapBound(S2Cap *__return_storage_ptr__,S2CellUnion *this)

{
  bool bVar1;
  int level;
  reference pSVar2;
  S2Cell local_168;
  S2Cap local_130;
  uint64 local_108;
  S2CellId id_1;
  const_iterator __end1_1;
  __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_e8;
  const_iterator __begin1_1;
  S2CellUnion *__range1_1;
  D local_d0;
  Vector3<double> local_b8;
  Vector3<double> local_a0;
  S2Point local_88;
  Vector3<double> local_70;
  double local_58;
  double area;
  S2CellId id;
  const_iterator __end1;
  const_iterator __begin1;
  S2CellUnion *__range1;
  S2Point centroid;
  S2CellUnion *this_local;
  S2Cap *cap;
  
  centroid.c_[2] = (VType)this;
  bVar1 = std::vector<S2CellId,_std::allocator<S2CellId>_>::empty(&this->cell_ids_);
  if (bVar1) {
    S2Cap::Empty();
  }
  else {
    Vector3<double>::Vector3((Vector3<double> *)&__range1,0.0,0.0,0.0);
    __end1 = begin(this);
    id.id_ = (uint64)end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                       *)&id), bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
               ::operator*(&__end1);
      area = (double)pSVar2->id_;
      level = S2CellId::level((S2CellId *)&area);
      local_58 = S2Cell::AverageArea(level);
      S2CellId::ToPoint(&local_88,(S2CellId *)&area);
      util::math::internal_vector::operator*
                (&local_70,&local_58,(BasicVector<Vector3,_double,_3UL> *)&local_88);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                ((BasicVector<Vector3,_double,_3UL> *)&__range1,&local_70);
      __gnu_cxx::
      __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
      operator++(&__end1);
    }
    Vector3<double>::Vector3(&local_a0,0.0,0.0,0.0);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)&__range1,&local_a0);
    if (bVar1) {
      Vector3<double>::Vector3(&local_b8,1.0,0.0,0.0);
      __range1 = (S2CellUnion *)local_b8.c_[0];
      centroid.c_[0] = local_b8.c_[1];
      centroid.c_[1] = local_b8.c_[2];
    }
    else {
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                (&local_d0,(BasicVector<Vector3,_double,_3UL> *)&__range1);
      __range1 = (S2CellUnion *)local_d0.c_[0];
      centroid.c_[0] = local_d0.c_[1];
      centroid.c_[1] = local_d0.c_[2];
    }
    S2Cap::FromPoint(__return_storage_ptr__,(S2Point *)&__range1);
    __begin1_1._M_current = (S2CellId *)this;
    local_e8._M_current = (S2CellId *)begin(this);
    id_1.id_ = (uint64)end((S2CellUnion *)__begin1_1._M_current);
    while (bVar1 = __gnu_cxx::operator!=
                             (&local_e8,
                              (__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                               *)&id_1), bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
               ::operator*(&local_e8);
      local_108 = pSVar2->id_;
      S2Cell::S2Cell(&local_168,(S2CellId)local_108);
      S2Cell::GetCapBound(&local_130,&local_168);
      S2Cap::AddCap(__return_storage_ptr__,&local_130);
      S2Cap::~S2Cap(&local_130);
      S2Cell::~S2Cell(&local_168);
      __gnu_cxx::
      __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
      operator++(&local_e8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2CellUnion::GetCapBound() const {
  // Compute the approximate centroid of the region.  This won't produce the
  // bounding cap of minimal area, but it should be close enough.
  if (cell_ids_.empty()) return S2Cap::Empty();
  S2Point centroid(0, 0, 0);
  for (S2CellId id : *this) {
    double area = S2Cell::AverageArea(id.level());
    centroid += area * id.ToPoint();
  }
  if (centroid == S2Point(0, 0, 0)) {
    centroid = S2Point(1, 0, 0);
  } else {
    centroid = centroid.Normalize();
  }

  // Use the centroid as the cap axis, and expand the cap angle so that it
  // contains the bounding caps of all the individual cells.  Note that it is
  // *not* sufficient to just bound all the cell vertices because the bounding
  // cap may be concave (i.e. cover more than one hemisphere).
  S2Cap cap = S2Cap::FromPoint(centroid);
  for (S2CellId id : *this) {
    cap.AddCap(S2Cell(id).GetCapBound());
  }
  return cap;
}